

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Flatten_x86_fma::forward_int8
          (Flatten_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  bool bVar21;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar1 = bottom_blob->dims;
  if (uVar1 == 1) {
    iVar15 = 0;
    if (top_blob != bottom_blob) {
      piVar5 = bottom_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar5 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar5;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar11 = bottom_blob->w;
      iVar4 = bottom_blob->h;
      iVar12 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar11;
      top_blob->h = iVar4;
      top_blob->d = iVar12;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar11 = bottom_blob->w;
    lVar19 = (long)iVar11;
    uVar2 = bottom_blob->h;
    uVar3 = bottom_blob->c;
    uVar17 = bottom_blob->elemsize;
    iVar12 = uVar2 * iVar11 * bottom_blob->d;
    iVar4 = bottom_blob->elempack;
    uVar14 = uVar3 * iVar4 * iVar12;
    bVar21 = (uVar14 & 7) == 0;
    sVar20 = uVar17 / (ulong)(long)iVar4 << ((opt->use_packing_layout & bVar21) != 0U) * '\x03';
    if ((opt->use_packing_layout & bVar21) == 0) {
      iVar11 = Flatten::forward((Flatten *)
                                ((long)&this->_vptr_Flatten_x86_fma +
                                (long)this->_vptr_Flatten_x86_fma[-3]),bottom_blob,top_blob,opt);
      return iVar11;
    }
    iVar15 = (int)uVar14 >> 3;
    if (iVar4 == 1 && (uVar1 ^ 2) == 0) {
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = top_blob->data;
            pAVar7 = top_blob->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar6,uVar17 % (ulong)(long)iVar4);
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->allocator = bottom_blob->allocator;
        iVar11 = bottom_blob->c;
        top_blob->d = bottom_blob->d;
        top_blob->c = iVar11;
      }
      top_blob->dims = 1;
      top_blob->w = iVar15;
      top_blob->h = 1;
      top_blob->cstep = (long)iVar15;
      top_blob->elemsize = sVar20;
      top_blob->elempack = 8;
      iVar15 = 0;
    }
    else {
      Mat::create(top_blob,iVar15,sVar20,8,opt->blob_allocator);
      iVar15 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (0 < (int)uVar2 && ((uVar1 ^ 2) == 0 && iVar4 == 8)) {
          iVar15 = 0;
          uVar17 = 0;
          lVar16 = lVar19;
          do {
            if (0 < iVar11) {
              pvVar6 = top_blob->data;
              lVar18 = bottom_blob->elemsize * uVar17 * (long)bottom_blob->w;
              pvVar8 = bottom_blob->data;
              lVar13 = 0;
              do {
                *(undefined1 *)((long)pvVar6 + lVar13 + iVar15) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18);
                *(undefined1 *)((long)pvVar6 + lVar13 + lVar16) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 1);
                *(undefined1 *)((long)pvVar6 + lVar19 + lVar13 + lVar16) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 2);
                lVar10 = lVar19 + lVar13 + lVar16;
                *(undefined1 *)((long)pvVar6 + lVar19 + lVar10) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 3);
                lVar10 = lVar19 + lVar10;
                *(undefined1 *)((long)pvVar6 + lVar19 + lVar10) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 4);
                lVar10 = lVar19 + lVar10;
                *(undefined1 *)((long)pvVar6 + lVar19 + lVar10) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 5);
                lVar10 = lVar19 + lVar10;
                *(undefined1 *)((long)pvVar6 + lVar19 + lVar10) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 6);
                *(undefined1 *)((long)pvVar6 + lVar19 * 2 + lVar10) =
                     *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar18 + 7);
                lVar13 = lVar13 + 1;
              } while (iVar11 != (int)lVar13);
            }
            uVar17 = uVar17 + 1;
            lVar16 = lVar16 + lVar19 * 8;
            iVar15 = iVar15 + iVar11 * 8;
          } while (uVar17 != uVar2);
        }
        iVar15 = 0;
        if (uVar1 - 3 < 2) {
          if (0 < (int)uVar3 && iVar4 == 8) {
            local_38 = (long)iVar12;
            lVar19 = local_38 * 8;
            local_40 = local_38 * 7;
            local_48 = local_38 * 2;
            local_50 = local_38 * 6;
            local_58 = local_38 * 5;
            local_60 = local_38 * 4;
            local_68 = local_38 * 3;
            iVar11 = 0;
            uVar17 = 0;
            do {
              if (0 < iVar12) {
                pvVar6 = top_blob->data;
                lVar16 = bottom_blob->cstep * bottom_blob->elemsize * uVar17;
                pvVar8 = bottom_blob->data;
                lVar13 = 0;
                do {
                  *(undefined1 *)((long)pvVar6 + lVar13 + iVar11) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_38) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 1);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_48) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 2);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_68) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 3);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_60) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 4);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_58) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 5);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_50) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 6);
                  *(undefined1 *)((long)pvVar6 + lVar13 + local_40) =
                       *(undefined1 *)((long)pvVar8 + lVar13 * 8 + lVar16 + 7);
                  lVar13 = lVar13 + 1;
                } while (iVar12 != (int)lVar13);
              }
              uVar17 = uVar17 + 1;
              local_40 = local_40 + lVar19;
              local_50 = local_50 + lVar19;
              local_58 = local_58 + lVar19;
              local_60 = local_60 + lVar19;
              local_68 = local_68 + lVar19;
              local_48 = local_48 + lVar19;
              local_38 = local_38 + lVar19;
              iVar11 = iVar11 + iVar12 * 8;
            } while (uVar17 != uVar3);
          }
          iVar15 = 0;
          if (iVar4 == 1 && 0 < (int)uVar3) {
            lVar19 = 0;
            uVar17 = 0;
            iVar15 = 0;
            do {
              if (0 < iVar12) {
                sVar20 = bottom_blob->cstep;
                pvVar6 = top_blob->data;
                sVar9 = bottom_blob->elemsize;
                pvVar8 = bottom_blob->data;
                lVar16 = 0;
                do {
                  *(undefined1 *)((long)pvVar6 + lVar16 + lVar19) =
                       *(undefined1 *)((long)pvVar8 + lVar16 + sVar20 * sVar9 * uVar17);
                  lVar16 = lVar16 + 1;
                } while (iVar12 != (int)lVar16);
              }
              uVar17 = uVar17 + 1;
              lVar19 = lVar19 + iVar12;
            } while (uVar17 != uVar3);
          }
        }
      }
    }
  }
  return iVar15;
}

Assistant:

int Flatten_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
        out_elempack = total % 8 == 0 ? 8 : 1;
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* ptr = bottom_blob.row<const signed char>(i);
                signed char* outptr0 = (signed char*)top_blob + w * i * 8;
                signed char* outptr1 = (signed char*)top_blob + w * (i * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + w * (i * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + w * (i * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + w * (i * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + w * (i * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + w * (i * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr0 = (signed char*)top_blob + size * q * 8;
                signed char* outptr1 = (signed char*)top_blob + size * (q * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + size * (q * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + size * (q * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + size * (q * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + size * (q * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + size * (q * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }

        if (elempack == 1) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr = (signed char*)top_blob + size * q;

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}